

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O0

void __thiscall
duckdb::DbpDecoder::DbpDecoder(DbpDecoder *this,data_ptr_t buffer,uint32_t buffer_len)

{
  data_ptr_t pdVar1;
  unsigned_long uVar2;
  uint64_t uVar3;
  InvalidInputException *this_00;
  uint in_EDX;
  data_ptr_t in_RSI;
  ByteBuffer *in_RDI;
  unsigned_long in_stack_ffffffffffffffa0;
  allocator *paVar4;
  ByteBuffer *in_stack_ffffffffffffffc0;
  string local_38 [56];
  
  ByteBuffer::ByteBuffer(in_RDI,in_RSI,(ulong)in_EDX);
  pdVar1 = (data_ptr_t)
           ParquetDecodeUtils::VarintDecode<unsigned_long,true>(in_stack_ffffffffffffffc0);
  in_RDI[1].ptr = pdVar1;
  uVar2 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(in_stack_ffffffffffffffc0);
  in_RDI[1].len = uVar2;
  in_RDI[2].ptr = (data_ptr_t)((ulong)in_RDI[1].ptr / in_RDI[1].len);
  uVar2 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(in_stack_ffffffffffffffc0);
  in_RDI[2].len = uVar2;
  ParquetDecodeUtils::VarintDecode<unsigned_long,true>(in_stack_ffffffffffffffc0);
  pdVar1 = (data_ptr_t)ParquetDecodeUtils::ZigzagToInt<unsigned_long>(in_stack_ffffffffffffffa0);
  in_RDI[3].ptr = pdVar1;
  *(undefined1 *)&in_RDI[3].len = 1;
  in_RDI[4].ptr = (data_ptr_t)0x0;
  uVar3 = NumericLimits<long>::Maximum();
  in_RDI[4].len = uVar3;
  in_RDI[5].ptr = (data_ptr_t)(in_RDI[1].len - 1);
  in_RDI[5].len = 0;
  in_RDI[6].ptr = in_RDI[2].ptr;
  in_RDI[0x16].len = 0x20;
  if (((ulong)in_RDI[1].ptr % in_RDI[1].len == 0) && (((ulong)in_RDI[2].ptr & 0x1f) == 0)) {
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  paVar4 = (allocator *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"Parquet file has invalid block sizes for DELTA_BINARY_PACKED",paVar4);
  duckdb::InvalidInputException::InvalidInputException(this_00,local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
             );
}

Assistant:

DbpDecoder(const data_ptr_t buffer, const uint32_t buffer_len)
	    : buffer_(buffer, buffer_len),
	      //<block size in values> <number of miniblocks in a block> <total value count> <first value>
	      block_size_in_values(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_)),
	      number_of_miniblocks_per_block(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_)),
	      number_of_values_in_a_miniblock(block_size_in_values / number_of_miniblocks_per_block),
	      total_value_count(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_)),
	      previous_value(ParquetDecodeUtils::ZigzagToInt(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_))),
	      // init state to something sane
	      is_first_value(true), read_values(0), min_delta(NumericLimits<int64_t>::Maximum()),
	      miniblock_index(number_of_miniblocks_per_block - 1), list_of_bitwidths_of_miniblocks(nullptr),
	      miniblock_offset(number_of_values_in_a_miniblock),
	      unpacked_data_offset(BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
		if (!(block_size_in_values % number_of_miniblocks_per_block == 0 &&
		      number_of_values_in_a_miniblock % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0)) {
			throw InvalidInputException("Parquet file has invalid block sizes for DELTA_BINARY_PACKED");
		}
	}